

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O2

void test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempt_count,
               k_ary_constructor<long> *constructor)

{
  value_type_conflict2 *value;
  pointer plVar1;
  clock_t cVar2;
  clock_t cVar3;
  ulong uVar4;
  clock_t cVar5;
  iterator iVar6;
  clock_t cVar7;
  ostream *poVar8;
  runtime_error *this;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  k_ary_search_set<long,_std::less<void>_> set;
  
  cVar2 = clock();
  k_ary_constructor<long>::operator()
            (&set,constructor,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  cVar3 = clock();
  lVar10 = 0;
  sVar9 = attempt_count;
  while( true ) {
    bVar11 = sVar9 == 0;
    sVar9 = sVar9 - 1;
    if (bVar11) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_422b5);
      poVar8 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_422ce);
      poVar8 = std::ostream::_M_insert<double>
                         (((double)lVar10 /
                          (((double)CONCAT44(0x45300000,(int)(attempt_count >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)attempt_count) - 4503599627370496.0))) /
                          1000000.0);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&set);
      return;
    }
    uVar4 = random();
    plVar1 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    value = plVar1 + uVar4 % (ulong)((long)(numbers->super__Vector_base<long,_std::allocator<long>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)plVar1 >> 3);
    cVar5 = clock();
    iVar6 = burst::k_ary_search_set<long,_std::less<void>_>::find(&set,value);
    cVar7 = clock();
    if ((iVar6._M_current ==
         set.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish) || (*iVar6._M_current != *value)) break;
    lVar10 = (lVar10 - cVar5) + cVar7;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,anon_var_dwarf_4229c);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_one (const Container & numbers, std::size_t attempt_count, const SetConstructor & constructor)
{
    clock_t creation_time = clock();
    auto set = constructor(numbers.begin(), numbers.end());
    creation_time = clock() - creation_time;

    clock_t search_time = 0;
    for (std::size_t attempt = 0; attempt < attempt_count; ++attempt)
    {
        const auto & element = numbers[static_cast<std::size_t>(random()) % numbers.size()];

        clock_t attempt_time = clock();
        auto search_result = set.find(element);
        attempt_time = clock() - attempt_time;

        if (search_result == set.end() || *search_result != element)
        {
            throw std::runtime_error("Нашлись не все искомые элементы.");
        }

        search_time += attempt_time;
    }

    std::cout << "\tВремя создания: " << static_cast<double>(creation_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время поиска: " << static_cast<double>(search_time) / static_cast<double>(attempt_count) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}